

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void prefix_identifier(ch_compilation *comp)

{
  ch_token_kind cVar1;
  _Bool _Var2;
  ch_op op;
  ch_token identifier;
  
  cVar1 = (comp->previous).kind;
  _Var2 = consume(comp,TK_ID,"Expected identifier",&identifier);
  if (_Var2) {
    load_variable(comp,identifier.lexeme);
    if (cVar1 == TK_PLUS_PLUS) {
      op = OP_ADDONE;
    }
    else {
      op = OP_SUBONE;
    }
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op,1);
    op = OP_TOP;
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op,1);
    set_variable(comp,identifier.lexeme);
  }
  return;
}

Assistant:

void prefix_identifier(ch_compilation *comp) {
  ch_token token = comp->previous;
  ch_token identifier;
  if (!consume(comp, TK_ID, "Expected identifier", &identifier)) return;

  load_variable(comp, identifier.lexeme);

  if (token.kind == TK_PLUS_PLUS) {
    EMIT_OP(GET_EMIT(comp), OP_ADDONE);
  } else {
    EMIT_OP(GET_EMIT(comp), OP_SUBONE);
  }

  // Duplicate its value so that the new value stays on the stack
  EMIT_OP(GET_EMIT(comp), OP_TOP);
  set_variable(comp, identifier.lexeme);
  return;
}